

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix4d * tinyusdz::to_matrix(matrix4d *__return_storage_ptr__,quath *q)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double3x3 m33;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  fVar2 = value::half_to_float((half)(q->imag)._M_elems[0].value);
  fVar3 = value::half_to_float((half)(q->imag)._M_elems[1].value);
  fVar4 = value::half_to_float((half)(q->imag)._M_elems[2].value);
  fVar5 = value::half_to_float((half)(q->real).value);
  local_38._8_4_ = SUB84((double)fVar3,0);
  local_38._0_8_ = (double)fVar2;
  local_38._12_4_ = (int)((ulong)(double)fVar3 >> 0x20);
  local_28._8_4_ = SUB84((double)fVar5,0);
  local_28._0_8_ = (double)fVar4;
  local_28._12_4_ = (int)((ulong)(double)fVar5 >> 0x20);
  linalg::qmat<double>((vec<double,_4> *)local_38);
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 0.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[3][3] = 0.0;
  lVar1 = 0;
  do {
    *(undefined8 *)((long)__return_storage_ptr__->m[0] + lVar1) = 0x3ff0000000000000;
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0xa0);
  __return_storage_ptr__->m[0][0] = local_88;
  __return_storage_ptr__->m[0][1] = dStack_80;
  __return_storage_ptr__->m[0][2] = local_78;
  __return_storage_ptr__->m[1][0] = local_70;
  __return_storage_ptr__->m[1][1] = dStack_68;
  __return_storage_ptr__->m[1][2] = local_60;
  __return_storage_ptr__->m[2][0] = local_58;
  __return_storage_ptr__->m[2][1] = dStack_50;
  __return_storage_ptr__->m[2][2] = local_48;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d to_matrix(const value::quath &q) {
  // using double4 = linalg::aliases::double4;

  double3x3 m33 = linalg::qmat<double>(
      {double(half_to_float(q.imag[0])), double(half_to_float(q.imag[1])),
       double(half_to_float(q.imag[2])), double(half_to_float(q.real))});

  value::matrix4d m;
  Identity(&m);

  m.m[0][0] = m33[0][0];
  m.m[0][1] = m33[0][1];
  m.m[0][2] = m33[0][2];
  m.m[1][0] = m33[1][0];
  m.m[1][1] = m33[1][1];
  m.m[1][2] = m33[1][2];
  m.m[2][0] = m33[2][0];
  m.m[2][1] = m33[2][1];
  m.m[2][2] = m33[2][2];

  return m;
}